

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Vdbe * sqlite3VdbeCreate(Parse *pParse)

{
  sqlite3 *db_00;
  Vdbe *p;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pParse_local = (Parse *)sqlite3DbMallocRawNN(db_00,0x120);
  if (pParse_local == (Parse *)0x0) {
    pParse_local = (Parse *)0x0;
  }
  else {
    memset(&pParse_local->constraintName,0,0xb8);
    pParse_local->db = db_00;
    if (db_00->pVdbe != (Vdbe *)0x0) {
      db_00->pVdbe->pPrev = (Vdbe *)pParse_local;
    }
    pParse_local->pVdbe = db_00->pVdbe;
    pParse_local->zErrMsg = (char *)0x0;
    db_00->pVdbe = (Vdbe *)pParse_local;
    *(u32 *)&pParse_local->disableLookaside = 0x16bceaa5;
    *(Parse **)&pParse_local->rc = pParse;
  }
  return (Vdbe *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(Parse *pParse){
  sqlite3 *db = pParse->db;
  Vdbe *p;
  p = sqlite3DbMallocRawNN(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  memset(&p->aOp, 0, sizeof(Vdbe)-offsetof(Vdbe,aOp));
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->pPrev = p;
  }
  p->pNext = db->pVdbe;
  p->pPrev = 0;
  db->pVdbe = p;
  p->magic = VDBE_MAGIC_INIT;
  p->pParse = pParse;
  assert( pParse->aLabel==0 );
  assert( pParse->nLabel==0 );
  assert( pParse->nOpAlloc==0 );
  assert( pParse->szOpAlloc==0 );
  return p;
}